

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * str_endswith_nocase(char *str,char *suffix)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  char *strsuffix;
  int suffixl;
  int strl;
  undefined8 local_8;
  
  iVar1 = str_length((char *)0x25863c);
  iVar2 = str_length((char *)0x25864a);
  if (iVar1 < iVar2) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)((in_RDI + iVar1) - (long)iVar2);
    iVar1 = str_comp_nocase((char *)CONCAT44(iVar1,iVar2),local_8);
    if (iVar1 != 0) {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char *str_endswith_nocase(const char *str, const char *suffix)
{
	int strl = str_length(str);
	int suffixl = str_length(suffix);
	const char *strsuffix;
	if(strl < suffixl)
	{
		return 0;
	}
	strsuffix = str + strl - suffixl;
	if(str_comp_nocase(strsuffix, suffix) == 0)
	{
		return strsuffix;
	}
	else
	{
		return 0;
	}
}